

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread.c
# Opt level: O1

int test_start_n_thread(_func_void_void_ptr *func,TEST_ARGS *args)

{
  int64_t iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  pthread_t *__ptr;
  int *ptr;
  ulong uVar4;
  long lVar5;
  int64_t *piVar6;
  int *piVar7;
  pthread_t *__newthread;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  lVar5 = args->num_threads;
  __ptr = (pthread_t *)malloc(lVar5 * 8);
  uVar8 = (uint)lVar5;
  ptr = (int *)calloc(1,(long)(int)uVar8 * 0x18);
  auVar2 = _DAT_001020d0;
  if (0 < (int)uVar8) {
    iVar1 = args->N;
    uVar4 = (ulong)(uVar8 + 1 & 0xfffffffe);
    lVar5 = (ulong)(uVar8 & 0x7fffffff) - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    piVar6 = (int64_t *)(ptr + 8);
    auVar9 = auVar9 ^ _DAT_001020d0;
    auVar10 = _DAT_001020c0;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        piVar6[-3] = iVar1;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *piVar6 = iVar1;
      }
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar5 + 2;
      piVar6 = piVar6 + 6;
      uVar4 = uVar4 - 2;
    } while (uVar4 != 0);
  }
  if (0 < (int)uVar8) {
    uVar4 = (ulong)(uVar8 & 0x7fffffff);
    piVar7 = ptr;
    __newthread = __ptr;
    do {
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,(__start_routine *)func,piVar7);
      if (iVar3 != 0) {
        return 0;
      }
      piVar7 = piVar7 + 6;
      __newthread = __newthread + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if ((int)uVar8 < 1) {
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    uVar4 = 0;
    piVar7 = ptr;
    do {
      pthread_join(__ptr[uVar4],(void **)0x0);
      if (*piVar7 == 0) {
        iVar3 = 0;
      }
      uVar4 = uVar4 + 1;
      piVar7 = piVar7 + 6;
    } while ((uVar8 & 0x7fffffff) != uVar4);
  }
  free(__ptr);
  CRYPTO_free(ptr);
  return iVar3;
}

Assistant:

int test_start_n_thread(void (*func)(void *), TEST_ARGS *args)
{
    int i;
    int ret = GML_OK;
    int num_threads = args->num_threads;
    pthread_t *t;

    t = (pthread_t*)malloc(sizeof(pthread_t) * args->num_threads);
    TEST_ARGS *test_args = calloc(1, num_threads*sizeof(TEST_ARGS));

    /* copy arguments */
    for (int i = 0; i < num_threads; i++)
        test_args[i].N = args->N;

    /* start threads */
    for (i = 0; i < num_threads; i++)
        if (pthread_create(&t[i], NULL, (void*)func, (void*)&test_args[i]))
            return GML_ERROR;

    // sleep(5);

    // pthread_mutex_lock(&mut);
    // for(i = 0; i < n; i++)
    // {
    //     pthread_cond_signal(&cond[i]);
    // }
    // pthread_mutex_unlock(&mut);

    for (int i = 0; i < num_threads; i++) {
        pthread_join(t[i], NULL);
        if (test_args[i].ok == GML_ERROR)
            ret = GML_ERROR;
    }

    free(t);
    CRYPTO_free(test_args);
    return ret;
}